

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O0

void __thiscall
JsrtDebugManager::ReportBreak(JsrtDebugManager *this,InterpreterHaltState *haltState)

{
  code *pcVar1;
  anon_class_32_4_78ef0979 map;
  DynamicObject *object;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContext *scriptContext_00;
  DebugContext *this_00;
  JsrtDebugPropertyId local_9c;
  Utf8SourceInfo **local_98;
  undefined1 *puStack_90;
  long local_88;
  UINT *pUStack_80;
  UINT local_74;
  ProbeContainer *pPStack_70;
  UINT bpId;
  ProbeContainer *probeContainer;
  DynamicObject *local_58;
  DynamicObject *eventDataObject;
  JsrtDebugEventObject debugEventObject;
  JsDiagDebugEvent jsDiagDebugEvent;
  ScriptContext *scriptContext;
  Utf8SourceInfo *pUStack_28;
  int currentByteCodeOffset;
  Utf8SourceInfo *utf8SourceInfo;
  FunctionBody *functionBody;
  InterpreterHaltState *haltState_local;
  JsrtDebugManager *this_local;
  
  if (this->debugEventCallback != (JsDiagDebugEventCallback)0x0) {
    functionBody = (FunctionBody *)haltState;
    haltState_local = (InterpreterHaltState *)this;
    utf8SourceInfo = (Utf8SourceInfo *)Js::InterpreterHaltState::GetFunction(haltState);
    if ((FunctionBody *)utf8SourceInfo == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
                         ,0x100,"(functionBody != nullptr)","functionBody != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    pUStack_28 = Js::FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)utf8SourceInfo);
    scriptContext._4_4_ =
         Js::InterpreterHaltState::GetCurrentOffset((InterpreterHaltState *)functionBody);
    scriptContext_00 = Js::Utf8SourceInfo::GetScriptContext(pUStack_28);
    debugEventObject.scriptContext._4_4_ =
         GetDebugEventFromStopType
                   (this,*(StopType *)
                          &(functionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                           super_FinalizableObject.super_IRecyclerVisitedObject.
                           _vptr_IRecyclerVisitedObject);
    JsrtDebugEventObject::JsrtDebugEventObject
              ((JsrtDebugEventObject *)&eventDataObject,scriptContext_00);
    local_58 = JsrtDebugEventObject::GetEventDataObject((JsrtDebugEventObject *)&eventDataObject);
    this_00 = Js::ScriptContext::GetDebugContext(scriptContext_00);
    pPStack_70 = Js::DebugContext::GetProbeContainer(this_00);
    if (debugEventObject.scriptContext._4_4_ == JsDiagDebugEventBreakpoint) {
      local_74 = 0;
      local_98 = &utf8SourceInfo;
      puStack_90 = (undefined1 *)&stack0xffffffffffffffd8;
      local_88 = (long)&scriptContext + 4;
      pUStack_80 = &local_74;
      map.utf8SourceInfo = (Utf8SourceInfo **)puStack_90;
      map.functionBody = (FunctionBody **)local_98;
      map.currentByteCodeOffset = (int *)local_88;
      map.bpId = pUStack_80;
      Js::ProbeContainer::
      MapProbesUntil<JsrtDebugManager::ReportBreak(Js::InterpreterHaltState*)::__0>(pPStack_70,map);
      if (local_74 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
                           ,0x11c,"(bpId != 0)",
                           "How come we don\'t have a breakpoint id for JsDiagDebugEventBreakpoint")
        ;
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      object = local_58;
      JsrtDebugPropertyId::JsrtDebugPropertyId(&local_9c,breakpointId);
      JsrtDebugUtils::AddPropertyToObject(object,local_9c,local_74,scriptContext_00);
    }
    JsrtDebugUtils::AddScriptIdToObject(local_58,pUStack_28);
    JsrtDebugUtils::AddLineColumnToObject
              (local_58,(FunctionBody *)utf8SourceInfo,scriptContext._4_4_);
    JsrtDebugUtils::AddSourceLengthAndTextToObject
              (local_58,(FunctionBody *)utf8SourceInfo,scriptContext._4_4_);
    CallDebugEventCallbackForBreak
              (this,debugEventObject.scriptContext._4_4_,local_58,scriptContext_00);
    JsrtDebugEventObject::~JsrtDebugEventObject((JsrtDebugEventObject *)&eventDataObject);
  }
  return;
}

Assistant:

void JsrtDebugManager::ReportBreak(Js::InterpreterHaltState* haltState)
{
    if (this->debugEventCallback != nullptr)
    {
        Js::FunctionBody* functionBody = haltState->GetFunction();
        Assert(functionBody != nullptr);

        Js::Utf8SourceInfo* utf8SourceInfo = functionBody->GetUtf8SourceInfo();
        int currentByteCodeOffset = haltState->GetCurrentOffset();
        Js::ScriptContext* scriptContext = utf8SourceInfo->GetScriptContext();

        JsDiagDebugEvent jsDiagDebugEvent = this->GetDebugEventFromStopType(haltState->stopType);

        JsrtDebugEventObject debugEventObject(scriptContext);

        Js::DynamicObject* eventDataObject = debugEventObject.GetEventDataObject();

        Js::ProbeContainer* probeContainer = scriptContext->GetDebugContext()->GetProbeContainer();

        if (jsDiagDebugEvent == JsDiagDebugEventBreakpoint)
        {
            UINT bpId = 0;
            probeContainer->MapProbesUntil([&](int i, Js::Probe* pProbe)
            {
                Js::BreakpointProbe* bp = (Js::BreakpointProbe*)pProbe;
                if (bp->Matches(functionBody, utf8SourceInfo->GetDebugDocument(), currentByteCodeOffset))
                {
                    bpId = bp->GetId();
                    return true;
                }
                return false;
            });

            AssertMsg(bpId != 0, "How come we don't have a breakpoint id for JsDiagDebugEventBreakpoint");

            JsrtDebugUtils::AddPropertyToObject(eventDataObject, JsrtDebugPropertyId::breakpointId, bpId, scriptContext);
        }

        JsrtDebugUtils::AddScriptIdToObject(eventDataObject, utf8SourceInfo);
        JsrtDebugUtils::AddLineColumnToObject(eventDataObject, functionBody, currentByteCodeOffset);
        JsrtDebugUtils::AddSourceLengthAndTextToObject(eventDataObject, functionBody, currentByteCodeOffset);

        this->CallDebugEventCallbackForBreak(jsDiagDebugEvent, eventDataObject, scriptContext);
    }
}